

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_b20dc::ParserImpl::ParsePrefixExpTail
          (ParserImpl *this,
          unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *exp,
          PrefixExpType *type)

{
  undefined4 uVar1;
  GCObject *pGVar2;
  long *plVar3;
  __uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true> _Var4;
  undefined4 uVar5;
  undefined4 uVar6;
  SyntaxTree *pSVar7;
  SyntaxTree *pSVar8;
  TokenDetail op;
  int iVar9;
  TokenDetail *pTVar10;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> uVar11;
  TokenDetail *pTVar12;
  undefined4 extraout_var;
  ParseException *pPVar13;
  undefined4 *in_RCX;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aVar14;
  bool bVar15;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> exp_1;
  TokenDetail member;
  GCObject *local_78;
  Lexer *local_70;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_68;
  undefined8 uStack_60;
  SyntaxTree *local_58;
  SyntaxTree *pSStack_50;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_48;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_40;
  String *local_38;
  
  pTVar10 = (TokenDetail *)(exp + 5);
  iVar9 = *(int *)&exp[8]._M_t.
                   super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                   .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  if (iVar9 == 0x11e) {
    luna::Lexer::GetToken
              ((Lexer *)(exp->_M_t).
                        super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                        .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,pTVar10);
    iVar9 = *(int *)&exp[8]._M_t.
                     super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                     .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  }
  if (iVar9 == 0x5b) {
LAB_0015196e:
    if (in_RCX != (undefined4 *)0x0) {
      *in_RCX = 1;
    }
    pGVar2 = *(GCObject **)type;
    type[0] = PrefixExpType_Normal;
    type[1] = PrefixExpType_Normal;
    NextToken((ParserImpl *)exp);
    pTVar12 = (TokenDetail *)(exp + 1);
    iVar9 = *(int *)&exp[4]._M_t.
                     super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                     .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    if (iVar9 == 0x2e) {
      pTVar10 = NextToken((ParserImpl *)exp);
      if (pTVar10->token_ != 0x115) {
        pPVar13 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException(pPVar13,"expect \'id\' after \'.\'",pTVar12);
        __cxa_throw(pPVar13,&luna::ParseException::typeinfo,luna::Exception::~Exception);
      }
      local_40.str_ = (String *)operator_new(0x38);
      ((local_40.str_)->super_GCObject)._vptr_GCObject = (_func_int **)&PTR__MemberAccessor_001884c8
      ;
      ((local_40.str_)->super_GCObject).next_ = pGVar2;
      uVar1 = *(undefined4 *)
               ((long)&exp[1]._M_t.
                       super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                       .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 4);
      uVar5 = *(undefined4 *)
               &exp[2]._M_t.
                super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t
                .super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
                super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
      uVar6 = *(undefined4 *)
               ((long)&exp[2]._M_t.
                       super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                       .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 4);
      pSVar7 = exp[3]._M_t.
               super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
               super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
               super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
      pSVar8 = exp[4]._M_t.
               super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
               super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
               super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
      *(undefined4 *)&((local_40.str_)->super_GCObject).field_0x10 =
           *(undefined4 *)&pTVar12->field_0;
      *(undefined4 *)&((local_40.str_)->super_GCObject).field_0x14 = uVar1;
      *(undefined4 *)&(local_40.str_)->field_1 = uVar5;
      *(undefined4 *)((long)&(local_40.str_)->field_1 + 4) = uVar6;
      *(SyntaxTree **)((long)&(local_40.str_)->field_1 + 8) = pSVar7;
      *(SyntaxTree **)&(local_40.str_)->length_ = pSVar8;
      *(undefined4 *)&(local_40.str_)->hash_ = 0;
    }
    else {
      if (iVar9 != 0x5b) {
        __assert_fail("current_.token_ == \'[\' || current_.token_ == \'.\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                      ,0x295,
                      "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseVar(std::unique_ptr<SyntaxTree>)"
                     );
      }
      if (*(int *)&exp[8]._M_t.
                   super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                   .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl == 0x11e) {
        luna::Lexer::GetToken
                  ((Lexer *)(exp->_M_t).
                            super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                            .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,pTVar10);
      }
      uVar1 = *(undefined4 *)
               &exp[7]._M_t.
                super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t
                .super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
                super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
      local_38 = (String *)0x0;
      local_68.number_ = 0.0;
      uStack_60 = (SyntaxTree *)0x0;
      local_58 = (SyntaxTree *)0x0;
      pSStack_50 = (SyntaxTree *)CONCAT44(pSStack_50._4_4_,0x11e);
      op.line_ = 0;
      op.column_ = 0;
      op.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
      op.module_ = (String *)0x0;
      op._24_8_ = pSStack_50;
      ParseExp((ParserImpl *)&local_70,exp,op,(int)&local_38);
      if (local_38 != (String *)0x0) {
        (*(local_38->super_GCObject)._vptr_GCObject[1])();
      }
      pTVar10 = NextToken((ParserImpl *)exp);
      if (pTVar10->token_ != 0x5d) {
        pPVar13 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException(pPVar13,"expect \']\'",pTVar12);
        __cxa_throw(pPVar13,&luna::ParseException::typeinfo,luna::Exception::~Exception);
      }
      local_40.str_ = (String *)operator_new(0x20);
      ((local_40.str_)->super_GCObject)._vptr_GCObject = (_func_int **)&PTR__IndexAccessor_00188488;
      ((local_40.str_)->super_GCObject).next_ = pGVar2;
      *(Lexer **)&((local_40.str_)->super_GCObject).field_0x10 = local_70;
      *(undefined4 *)&(local_40.str_)->field_1 = uVar1;
      *(undefined4 *)((long)&(local_40.str_)->field_1 + 4) = 0;
    }
    plVar3 = *(long **)type;
    *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)type = local_40;
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 8))();
      local_40 = *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)type;
    }
    type[0] = PrefixExpType_Normal;
    type[1] = PrefixExpType_Normal;
    uVar11 = ParsePrefixExpTail(this,exp,(PrefixExpType *)&local_40);
    aVar14 = local_40;
    goto LAB_00151cd4;
  }
  if (iVar9 == 0x11e) {
    luna::Lexer::GetToken
              ((Lexer *)(exp->_M_t).
                        super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                        .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,pTVar10);
    iVar9 = *(int *)&exp[8]._M_t.
                     super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                     .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  }
  if (iVar9 == 0x11e) {
    luna::Lexer::GetToken
              ((Lexer *)(exp->_M_t).
                        super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                        .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,pTVar10);
    iVar9 = *(int *)&exp[8]._M_t.
                     super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                     .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  }
  else if (iVar9 == 0x2e) goto LAB_0015196e;
  if (iVar9 != 0x3a) {
    if (iVar9 == 0x11e) {
      luna::Lexer::GetToken
                ((Lexer *)(exp->_M_t).
                          super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                          .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,pTVar10);
      iVar9 = *(int *)&exp[8]._M_t.
                       super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                       .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    }
    if (iVar9 != 0x28) {
      if (iVar9 == 0x11e) {
        luna::Lexer::GetToken
                  ((Lexer *)(exp->_M_t).
                            super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                            .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,pTVar10);
        iVar9 = *(int *)&exp[8]._M_t.
                         super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                         .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
      }
      if (iVar9 != 0x7b) {
        if (iVar9 == 0x11e) {
          luna::Lexer::GetToken
                    ((Lexer *)(exp->_M_t).
                              super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                              .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,pTVar10
                    );
          iVar9 = *(int *)&exp[8]._M_t.
                           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                           .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
        }
        bVar15 = iVar9 != 0x116;
        iVar9 = 0x116;
        if (bVar15) {
          _Var4.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t
          .super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
          super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl =
               *(__uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)type;
          this->lexer_ = (Lexer *)_Var4.
                                  super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                                  .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
          type[0] = PrefixExpType_Normal;
          type[1] = PrefixExpType_Normal;
          return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>
                  )(tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)
                   _Var4.
                   super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                   .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
        }
      }
    }
  }
  if (in_RCX == (undefined4 *)0x0) {
    local_78 = *(GCObject **)type;
    type[0] = PrefixExpType_Normal;
    type[1] = PrefixExpType_Normal;
  }
  else {
    *in_RCX = 2;
    iVar9 = *(int *)&exp[8]._M_t.
                     super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                     .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    local_78 = *(GCObject **)type;
    type[0] = PrefixExpType_Normal;
    type[1] = PrefixExpType_Normal;
    if (iVar9 == 0x11e) {
      luna::Lexer::GetToken
                ((Lexer *)(exp->_M_t).
                          super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                          .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,pTVar10);
      iVar9 = *(int *)&exp[8]._M_t.
                       super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                       .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    }
  }
  if (iVar9 == 0x11e) {
    luna::Lexer::GetToken
              ((Lexer *)(exp->_M_t).
                        super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                        .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,pTVar10);
LAB_00151c5c:
    uVar1 = *(undefined4 *)
             &exp[7]._M_t.
              super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
              super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
              super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    ParseArgs((ParserImpl *)&local_68);
    local_48.str_ = (String *)operator_new(0x20);
    ((local_48.str_)->super_GCObject)._vptr_GCObject = (_func_int **)&PTR__NormalFuncCall_00188508;
    ((local_48.str_)->super_GCObject).next_ = local_78;
    *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)&((local_48.str_)->super_GCObject).field_0x10 =
         local_68;
    *(undefined4 *)&(local_48.str_)->field_1 = uVar1;
  }
  else {
    if (iVar9 != 0x3a) goto LAB_00151c5c;
    NextToken((ParserImpl *)exp);
    pTVar12 = NextToken((ParserImpl *)exp);
    if (pTVar12->token_ != 0x115) {
      pPVar13 = (ParseException *)__cxa_allocate_exception(0x20);
      luna::ParseException::ParseException
                (pPVar13,"expect \'id\' after \':\'",(TokenDetail *)(exp + 1));
      __cxa_throw(pPVar13,&luna::ParseException::typeinfo,luna::Exception::~Exception);
    }
    local_68 = *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)(exp + 1);
    uStack_60 = exp[2]._M_t.
                super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t
                .super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
                super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    local_58 = exp[3]._M_t.
               super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
               super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
               super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    pSStack_50 = exp[4]._M_t.
                 super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
                 super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    if (*(int *)&exp[8]._M_t.
                 super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
                 super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl == 0x11e) {
      luna::Lexer::GetToken
                ((Lexer *)(exp->_M_t).
                          super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                          .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,pTVar10);
    }
    uVar1 = *(undefined4 *)
             &exp[7]._M_t.
              super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
              super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
              super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    ParseArgs((ParserImpl *)&local_70);
    local_48.str_ = (String *)operator_new(0x40);
    ((local_48.str_)->super_GCObject)._vptr_GCObject = (_func_int **)&PTR__MemberFuncCall_00188548;
    ((local_48.str_)->super_GCObject).next_ = local_78;
    *(undefined4 *)&((local_48.str_)->super_GCObject).field_0x10 = local_68._0_4_;
    *(undefined4 *)&((local_48.str_)->super_GCObject).field_0x14 = local_68._4_4_;
    *(undefined4 *)&(local_48.str_)->field_1 = (undefined4)uStack_60;
    *(undefined4 *)((long)&(local_48.str_)->field_1 + 4) = uStack_60._4_4_;
    *(SyntaxTree **)((long)&(local_48.str_)->field_1 + 8) = local_58;
    *(SyntaxTree **)&(local_48.str_)->length_ = pSStack_50;
    (local_48.str_)->hash_ = (size_t)local_70;
    *(undefined4 *)&local_48.str_[1].super_GCObject._vptr_GCObject = uVar1;
  }
  plVar3 = *(long **)type;
  *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)type = local_48;
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 8))();
    local_48 = *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)type;
  }
  type[0] = PrefixExpType_Normal;
  type[1] = PrefixExpType_Normal;
  uVar11 = ParsePrefixExpTail(this,exp,(PrefixExpType *)&local_48);
  aVar14 = local_48;
LAB_00151cd4:
  if (aVar14.str_ == (String *)0x0) {
    return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
           (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)
           uVar11._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  }
  uVar11._M_t.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
  super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
  super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl._0_4_ =
       (*((aVar14.str_)->super_GCObject)._vptr_GCObject[1])();
  uVar11._M_t.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
  super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
  super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl._4_4_ = extraout_var;
  return (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>)
         uVar11._M_t.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
         ._M_t.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
         super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<SyntaxTree> ParsePrefixExpTail(std::unique_ptr<SyntaxTree> exp,
                                                       PrefixExpType *type)
        {
            if (LookAhead().token_ == '[' || LookAhead().token_ == '.')
            {
                if (type) *type = PrefixExpType_Var;
                exp = ParseVar(std::move(exp));
                return ParsePrefixExpTail(std::move(exp), type);
            }
            else if (LookAhead().token_ == ':' || LookAhead().token_ == '(' ||
                     LookAhead().token_ == '{' || LookAhead().token_ == Token_String)
            {
                if (type) *type = PrefixExpType_Functioncall;
                exp = ParseFunctionCall(std::move(exp));
                return ParsePrefixExpTail(std::move(exp), type);
            }
            else
            {
                return exp;
            }
        }